

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *value)

{
  long *plVar1;
  bool bVar2;
  string v;
  string local_40;
  
  bVar2 = MaybeNone(this);
  if (bVar2) {
    if (value->has_value_ == true) {
      plVar1 = (long *)((long)&value->contained + 0x10);
      if (*(long **)&value->contained != plVar1) {
        operator_delete(*(long **)&value->contained,*plVar1 + 1);
      }
    }
    value->has_value_ = false;
    bVar2 = true;
  }
  else {
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    bVar2 = ReadBasicType(this,&local_40);
    if (bVar2) {
      nonstd::optional_lite::optional<std::__cxx11::string>::operator=
                ((optional<std::__cxx11::string> *)value,&local_40);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,
                      CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                               local_40.field_2._M_local_buf[0]) + 1);
    }
  }
  return bVar2;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<std::string> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  std::string v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}